

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O3

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
       *this)

{
  iterator __position;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  vector<int,std::allocator<int>> *this_00;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  key_type_conflict local_d5;
  int local_d4;
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_d0;
  _Any_data *local_c8;
  iterator local_c0;
  iterator local_90;
  iterator local_60;
  
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(&(this->source).source);
  local_d0 = &this->result;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&local_d0->_M_t);
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::begin(&local_60,
          (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
           *)(this->source).source.source.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::end(&local_90,
        (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
         *)(this->source).source.source.state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_c8 = (_Any_data *)&this->transformer;
  while( true ) {
    local_c0.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156c18;
    local_c0.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
    local_c0.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_90.source.source.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_90.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_90.source.source.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      _Var5._M_pi = local_90.source.source.state.
                    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_90.source.source.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_90.source.source.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_c0.valid = local_90.valid;
    bVar2 = IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
            ::iterator::operator!=(&local_60,&local_c0);
    local_c0.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156c18;
    local_c0.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    peVar1 = local_60.source.source.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar2) break;
    local_d4 = (*(local_60.source.source.state.
                  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_IState[3])(local_60.source.source.state.
                                  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
    if ((this->transformer).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar4 = std::__throw_bad_function_call();
      if (local_90.source.source.state.
          super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.source.source.state.
                   super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_60.source.source.state.
          super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.source.source.state.
                   super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      _Unwind_Resume(uVar4);
    }
    local_d5 = (*(this->transformer)._M_invoker)(local_c8,&local_d4);
    this_00 = (vector<int,std::allocator<int>> *)
              std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](local_d0,&local_d5);
    __position._M_current = *(int **)(this_00 + 8);
    if (__position._M_current == *(int **)(this_00 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (this_00,__position,&local_d4);
    }
    else {
      *__position._M_current = local_d4;
      *(int **)(this_00 + 8) = __position._M_current + 1;
    }
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(&local_60.source);
    iVar3 = (*peVar1->_vptr_IState[1])(peVar1);
    local_60.valid = SUB41(iVar3,0);
  }
  if (local_90.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.source.source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_60.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.source.source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->current)._M_node = (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}